

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tiles.cpp
# Opt level: O2

void __thiscall sfc::Tileset::save(Tileset *this,string *path)

{
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_28;
  
  native_data((byte_vec_t *)&_Stack_28,this);
  write_file<unsigned_char>
            (path,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&_Stack_28);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_28);
  return;
}

Assistant:

void Tileset::save(const std::string& path) const {
  write_file(path, native_data());
}